

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::baz(TestInterfaceImpl *this,BazContext context)

{
  Reader reader;
  bool bVar1;
  Type *func;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  undefined8 in_stack_fffffffffffffdd8;
  bool local_1f5;
  bool _kj_shouldLog;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  *local_1e8;
  Maybe<kj::Exception> local_1e0;
  Reader local_80;
  undefined1 local_50 [8];
  Reader params;
  TestInterfaceImpl *this_local;
  BazContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  params._reader._40_8_ = context.hook;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::getParams((Reader *)local_50,
              (CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
               *)&this_local);
  capnproto_test::capnp::test::TestInterface::BazParams::Reader::getS(&local_80,(Reader *)local_50);
  reader._reader.capTable = (CapTableReader *)local_80._reader.data;
  reader._reader.segment = (SegmentReader *)local_80._reader.capTable;
  reader._reader.data = local_80._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_80._reader._32_8_;
  reader._reader.dataSize = local_80._reader.nestingLimit;
  reader._reader.pointerCount = local_80._reader._44_2_;
  reader._reader._38_2_ = local_80._reader._46_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffdd8;
  checkTestMessage(reader);
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::releaseParams((CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
                   *)&this_local);
  local_1e8 = (CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
               *)&this_local;
  kj::
  runCatchingExceptions<capnp::_::TestInterfaceImpl::baz(capnp::CallContext<capnproto_test::capnp::test::TestInterface::BazParams,capnproto_test::capnp::test::TestInterface::BazResults>)::__0>
            (&local_1e0,(kj *)&local_1e8,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_1e0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1e0);
  if (!bVar1) {
    local_1f5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f5 != false) {
      kj::_::Debug::log<char_const(&)[88]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x388,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr\""
                 ,(char (*) [88])
                  "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr"
                );
      local_1f5 = false;
    }
  }
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::baz(BazContext context) {
  ++callCount;
  auto params = context.getParams();
  checkTestMessage(params.getS());
  context.releaseParams();
  EXPECT_ANY_THROW(context.getParams());

  return kj::READY_NOW;
}